

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParsePrefix(State *state)

{
  bool bVar1;
  bool bVar2;
  State *in_RDI;
  State *in_stack_00000008;
  bool in_stack_00000017;
  bool has_something;
  State *in_stack_00000018;
  ComplexityGuard guard;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar1) {
    bVar3 = false;
  }
  else {
    bVar1 = false;
    while( true ) {
      MaybeAppendSeparator((State *)0x3b194b);
      bVar2 = ParseTemplateParam(in_stack_00000008);
      if (((((!bVar2) &&
            (bVar2 = ParseDecltype((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                     in_stack_fffffffffffffff8)), !bVar2)) &&
           (bVar2 = ParseSubstitution(in_stack_00000018,in_stack_00000017), !bVar2)) &&
          ((bVar2 = ParseVendorExtendedType
                              ((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8
                                                )), !bVar2 &&
           (bVar2 = ParseUnscopedName(in_stack_00000008), !bVar2)))) &&
         ((bVar2 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                       in_stack_fffffffffffffff8),
                                     (char)((ulong)in_RDI >> 0x38)), !bVar2 ||
          (bVar2 = ParseUnnamedTypeName(in_stack_00000018), !bVar2)))) break;
      bVar1 = true;
      MaybeIncreaseNestLevel(in_RDI);
    }
    MaybeCancelLastSeparator(in_RDI);
    if ((bVar1) && (bVar1 = ParseTemplateArgs(in_stack_00000008), bVar1)) {
      bVar3 = ParsePrefix(in_stack_ffffffffffffffe8.state_);
    }
    else {
      bVar3 = true;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar3 & 1);
}

Assistant:

static bool ParsePrefix(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool has_something = false;
  while (true) {
    MaybeAppendSeparator(state);
    if (ParseTemplateParam(state) || ParseDecltype(state) ||
        ParseSubstitution(state, /*accept_std=*/true) ||
        // Although the official grammar does not mention it, nested-names
        // shaped like Nu14__some_builtinIiE6memberE occur in practice, and it
        // is not clear what else a compiler is supposed to do when a
        // vendor-extended type has named members.
        ParseVendorExtendedType(state) ||
        ParseUnscopedName(state) ||
        (ParseOneCharToken(state, 'M') && ParseUnnamedTypeName(state))) {
      has_something = true;
      MaybeIncreaseNestLevel(state);
      continue;
    }
    MaybeCancelLastSeparator(state);
    if (has_something && ParseTemplateArgs(state)) {
      return ParsePrefix(state);
    } else {
      break;
    }
  }
  return true;
}